

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O0

void llvm::yaml::MappingTraits<llvm::DWARFYAML::PubEntry>::mapping(IO *IO,PubEntry *Entry)

{
  void *pvVar1;
  PubEntry *Entry_local;
  IO *IO_local;
  
  yaml::IO::mapRequired<llvm::yaml::Hex32>(IO,"DieOffset",&Entry->DieOffset);
  pvVar1 = yaml::IO::getContext(IO);
  if ((*(byte *)((long)pvVar1 + 0x1c) & 1) != 0) {
    yaml::IO::mapRequired<llvm::yaml::Hex8>(IO,"Descriptor",&Entry->Descriptor);
  }
  yaml::IO::mapRequired<llvm::StringRef>(IO,"Name",&Entry->Name);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::PubEntry>::mapping(IO &IO,
                                                 DWARFYAML::PubEntry &Entry) {
  IO.mapRequired("DieOffset", Entry.DieOffset);
  if (reinterpret_cast<DWARFYAML::PubSection *>(IO.getContext())->IsGNUStyle)
    IO.mapRequired("Descriptor", Entry.Descriptor);
  IO.mapRequired("Name", Entry.Name);
}